

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

MapCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (MapCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
          *samples)

{
  pointer pUVar1;
  ulong uVar2;
  long lVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer puVar6;
  pointer puVar7;
  deUint64 *pdVar8;
  int *piVar9;
  uint uVar10;
  ulong target;
  size_type __n;
  ulong uVar11;
  float fVar12;
  float fVar13;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_5d;
  float local_5c;
  vector<float,_std::allocator<float>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_58);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 6;
  uVar10 = (uint)__n;
  if (0 < (int)uVar10) {
    pdVar8 = &(pUVar1->duration).fitResponseDuration;
    uVar11 = 0;
    do {
      local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = *pdVar8;
      uVar11 = uVar11 + 1;
      pdVar8 = pdVar8 + 8;
    } while ((uVar10 & 0x7fffffff) != uVar11);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_58,__n,&local_5d);
  pfVar5 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar10) {
    piVar9 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] =
           (float)*piVar9 /
           (((float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar11] / 1000.0) / 1000.0);
      uVar11 = uVar11 + 1;
      piVar9 = piVar9 + 0x10;
    } while ((uVar10 & 0x7fffffff) != uVar11);
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar4,pfVar5);
  }
  pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar12 = (float)(((long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1) * 0.5;
  fVar13 = floorf(fVar12);
  fVar12 = fVar12 - (float)(int)fVar13;
  __return_storage_ptr__->medianRate =
       (1.0 - fVar12) * pfVar4[(int)fVar13] + fVar12 * pfVar4[(int)fVar13 + 1];
  if (pfVar4 != (pointer)0x0) {
    operator_delete(pfVar4,(long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_58,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,&local_5d);
  pfVar5 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar10) {
    piVar9 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] =
           (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar11] -
           ((float)*piVar9 * fit->coefficient + fit->offset);
      uVar11 = uVar11 + 1;
      piVar9 = piVar9 + 0x10;
    } while ((uVar10 & 0x7fffffff) != uVar11);
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar4,pfVar5);
  }
  pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxDiffTime =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar13 = (float)(((long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_5c = fVar13 * 0.9;
  fVar12 = floorf(local_5c);
  __return_storage_ptr__->maxDiff9DecileTime =
       (1.0 - (local_5c - (float)(int)fVar12)) * pfVar4[(int)fVar12] +
       (local_5c - (float)(int)fVar12) * pfVar4[(int)fVar12 + 1];
  fVar13 = fVar13 * 0.5;
  fVar12 = floorf(fVar13);
  fVar13 = fVar13 - (float)(int)fVar12;
  __return_storage_ptr__->medianDiffTime =
       (1.0 - fVar13) * pfVar4[(int)fVar12] + fVar13 * pfVar4[(int)fVar12 + 1];
  if (pfVar4 != (pointer)0x0) {
    operator_delete(pfVar4,(long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_58,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,&local_5d);
  pfVar5 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar10) {
    piVar9 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      fVar12 = (float)*piVar9 * fit->coefficient + fit->offset;
      fVar13 = 0.0;
      if (1.0 <= fVar12) {
        fVar13 = ((float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar11] - fVar12) / fVar12;
      }
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = fVar13;
      uVar11 = uVar11 + 1;
      piVar9 = piVar9 + 0x10;
    } while ((uVar10 & 0x7fffffff) != uVar11);
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar4,pfVar5);
  }
  __return_storage_ptr__->maxRelDiffTime =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar13 = (float)(((long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_5c = fVar13 * 0.9;
  fVar12 = floorf(local_5c);
  __return_storage_ptr__->max9DecileRelDiffTime =
       (1.0 - (local_5c - (float)(int)fVar12)) *
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[(int)fVar12] +
       (local_5c - (float)(int)fVar12) *
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[(int)fVar12 + 1];
  fVar13 = fVar13 * 0.5;
  fVar12 = floorf(fVar13);
  fVar13 = fVar13 - (float)(int)fVar12;
  __return_storage_ptr__->medianRelDiffTime =
       (1.0 - fVar13) *
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[(int)fVar12] +
       fVar13 * local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[(int)fVar12 + 1];
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar7 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar6,puVar7);
  }
  (__return_storage_ptr__->result).minTime =
       (float)*local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  (__return_storage_ptr__->result).maxTime =
       (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  fVar13 = (float)(((long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  local_5c = fVar13 * 0.5;
  fVar12 = floorf(local_5c);
  (__return_storage_ptr__->result).medianTime =
       (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar12 + 1] * (local_5c - (float)(int)fVar12) +
       (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar12] *
       (1.0 - (local_5c - (float)(int)fVar12));
  local_5c = fVar13 * 0.1;
  fVar12 = floorf(local_5c);
  (__return_storage_ptr__->result).min2DecileTime =
       (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar12 + 1] * (local_5c - (float)(int)fVar12) +
       (float)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar12] *
       (1.0 - (local_5c - (float)(int)fVar12));
  fVar12 = floorf(fVar13 * 0.9);
  uVar11 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[(int)fVar12];
  target = uVar11;
  if ((long)uVar11 < 0) {
    target = (ulong)((uint)uVar11 & 1) | uVar11 >> 1;
  }
  fVar13 = fVar13 * 0.9 - (float)(int)fVar12;
  uVar2 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(int)fVar12 + 1];
  if ((long)uVar2 < 0) {
    target = uVar2 >> 1;
  }
  (__return_storage_ptr__->result).max9DecileTime =
       (float)uVar2 * fVar13 + (float)uVar11 * (1.0 - fVar13);
  operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            (&__return_storage_ptr__->map,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x0,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            (&__return_storage_ptr__->unmap,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x8,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            (&__return_storage_ptr__->write,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x10,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            (&__return_storage_ptr__->alloc,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x18,target);
  return __return_storage_ptr__;
}

Assistant:

static MapCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<MapBufferRangeDuration> >& samples)
{
	MapCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	stats.map	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::mapDuration);
	stats.unmap	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::unmapDuration);
	stats.write	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::writeDuration);
	stats.alloc	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::allocDuration);

	return stats;
}